

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

void libdef_push(BuildCtx *ctx,char *p,int arg)

{
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  undefined4 in_EDX;
  char *in_RSI;
  long in_RDI;
  double d;
  char *ep;
  int len;
  undefined8 in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  
  if (*(int *)(in_RDI + 8) == 7) {
    sVar4 = strlen(in_RSI);
    iVar3 = (int)sVar4;
    if (*in_RSI == '\"') {
      if ((iVar3 < 2) || (in_RSI[iVar3 + -1] != '\"')) {
LAB_0010f772:
        fprintf(_stderr,"Error: bad value for %sPUSH(%s)\n","LJLIB_",in_RSI);
        exit(1);
      }
      in_RSI[iVar3 + -1] = '\0';
      libdef_name(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    }
    else if ((*in_RSI < '0') || ('9' < *in_RSI)) {
      iVar2 = strcmp(in_RSI,"lastcl");
      if (iVar2 == 0) {
        if (&optr < optr + 1) {
          fprintf(_stderr,"Error: output buffer overflow\n");
          exit(1);
        }
        puVar1 = optr + 1;
        *optr = 0xfd;
        optr = puVar1;
      }
      else {
        if ((iVar3 < 5) || (iVar3 = strncmp(in_RSI,"top-",4), iVar3 != 0)) goto LAB_0010f772;
        if (&optr < optr + 2) {
          fprintf(_stderr,"Error: output buffer overflow\n");
          exit(1);
        }
        puVar1 = optr + 1;
        *optr = 0xfc;
        optr = puVar1;
        iVar3 = atoi(in_RSI + 4);
        puVar1 = optr + 1;
        *optr = (uint8_t)iVar3;
        optr = puVar1;
      }
    }
    else {
      strtod(in_RSI,(char **)&stack0xffffffffffffffe0);
      if (*in_stack_ffffffffffffffe0 != '\0') goto LAB_0010f772;
      if (&optr < optr + 9) {
        fprintf(_stderr,"Error: output buffer overflow\n");
        exit(1);
      }
      puVar1 = optr + 1;
      *optr = 0xfb;
      optr = puVar1;
      memcpy_endian(in_RSI,(void *)CONCAT44(in_EDX,iVar3),(size_t)in_stack_ffffffffffffffe0);
      optr = optr + 8;
    }
  }
  return;
}

Assistant:

static void libdef_push(BuildCtx *ctx, char *p, int arg)
{
  UNUSED(arg);
  if (ctx->mode == BUILD_libdef) {
    int len = (int)strlen(p);
    if (*p == '"') {
      if (len > 1 && p[len-1] == '"') {
	p[len-1] = '\0';
	libdef_name(p+1, LIBINIT_STRING);
	return;
      }
    } else if (*p >= '0' && *p <= '9') {
      char *ep;
      double d = strtod(p, &ep);
      if (*ep == '\0') {
	if (optr+1+sizeof(double) > obuf+sizeof(obuf)) {
	  fprintf(stderr, "Error: output buffer overflow\n");
	  exit(1);
	}
	*optr++ = LIBINIT_NUMBER;
	memcpy_endian(optr, &d, sizeof(double));
	optr += sizeof(double);
	return;
      }
    } else if (!strcmp(p, "lastcl")) {
      if (optr+1 > obuf+sizeof(obuf)) {
	fprintf(stderr, "Error: output buffer overflow\n");
	exit(1);
      }
      *optr++ = LIBINIT_LASTCL;
      return;
    } else if (len > 4 && !strncmp(p, "top-", 4)) {
      if (optr+2 > obuf+sizeof(obuf)) {
	fprintf(stderr, "Error: output buffer overflow\n");
	exit(1);
      }
      *optr++ = LIBINIT_COPY;
      *optr++ = (uint8_t)atoi(p+4);
      return;
    }
    fprintf(stderr, "Error: bad value for %sPUSH(%s)\n", LIBDEF_PREFIX, p);
    exit(1);
  }
}